

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O1

string * __thiscall
duckdb::Timestamp::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Timestamp *this,timestamp_t timestamp)

{
  size_type *psVar1;
  undefined **ppuVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  date_t date_00;
  ulong uVar6;
  undefined8 uVar7;
  dtime_t time;
  date_t date;
  ulong *local_80;
  long local_78;
  ulong local_70;
  long lStack_68;
  string local_60;
  dtime_t local_40;
  date_t local_34;
  string local_30;
  
  if (this == (Timestamp *)0x8000000000000001) {
    ppuVar2 = &Date::NINF;
LAB_002dd640:
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,*ppuVar2,(allocator *)&local_80)
    ;
    return __return_storage_ptr__;
  }
  if (this == (Timestamp *)0x7fffffffffffffff) {
    ppuVar2 = (undefined **)&Date::PINF;
    goto LAB_002dd640;
  }
  Convert((timestamp_t)this,&local_34,&local_40);
  Date::ToString_abi_cxx11_(&local_30,(Date *)(ulong)(uint)local_34.days,date_00);
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_30);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_70 = *puVar5;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *puVar5;
    local_80 = (ulong *)*plVar3;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  Time::ToString_abi_cxx11_(&local_60,(Time *)local_40.micros,(dtime_t)local_78);
  uVar6 = 0xf;
  if (local_80 != &local_70) {
    uVar6 = local_70;
  }
  if (uVar6 < local_60._M_string_length + local_78) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      uVar7 = local_60.field_2._M_allocated_capacity;
    }
    if (local_60._M_string_length + local_78 <= (ulong)uVar7) {
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_80);
      goto LAB_002dd73e;
    }
  }
  puVar4 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60._M_dataplus._M_p);
LAB_002dd73e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar7 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == &local_30.field_2) {
    return __return_storage_ptr__;
  }
  operator_delete(local_30._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

string Timestamp::ToString(timestamp_t timestamp) {
	if (timestamp == timestamp_t::infinity()) {
		return Date::PINF;
	}
	if (timestamp == timestamp_t::ninfinity()) {
		return Date::NINF;
	}

	date_t date;
	dtime_t time;
	Timestamp::Convert(timestamp, date, time);
	return Date::ToString(date) + " " + Time::ToString(time);
}